

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O3

void inputText(_GLFWwindow *window,uint32_t scancode)

{
  xkb_keysym_t xVar1;
  int iVar2;
  xkb_compose_feed_result xVar3;
  xkb_compose_status xVar4;
  uint keysym;
  uint32_t codepoint;
  xkb_keysym_t *keysyms;
  xkb_keysym_t *local_20;
  
  iVar2 = (*_glfw.wl.xkb.state_key_get_syms)(_glfw.wl.xkb.state,scancode + 8,&local_20);
  if (iVar2 == 1) {
    xVar1 = *local_20;
    keysym = xVar1;
    if ((_glfw.wl.xkb.composeState != (xkb_compose_state *)0x0 && xVar1 != 0) &&
       (xVar3 = (*_glfw.wl.xkb.compose_state_feed)(_glfw.wl.xkb.composeState,xVar1),
       xVar3 == XKB_COMPOSE_FEED_ACCEPTED)) {
      xVar4 = (*_glfw.wl.xkb.compose_state_get_status)(_glfw.wl.xkb.composeState);
      keysym = 0;
      if ((xVar4 != XKB_COMPOSE_COMPOSING) &&
         ((keysym = 0, xVar4 != XKB_COMPOSE_CANCELLED &&
          (keysym = xVar1, xVar4 == XKB_COMPOSE_COMPOSED)))) {
        keysym = (*_glfw.wl.xkb.compose_state_get_one_sym)(_glfw.wl.xkb.composeState);
      }
    }
    codepoint = _glfwKeySym2Unicode(keysym);
    if (codepoint != 0xffffffff) {
      _glfwInputChar(window,codepoint,_glfw.wl.xkb.modifiers,
                     (uint)((_glfw.wl.xkb.modifiers & 6) == 0));
    }
  }
  return;
}

Assistant:

static void inputText(_GLFWwindow* window, uint32_t scancode)
{
    const xkb_keysym_t* keysyms;
    const xkb_keycode_t keycode = scancode + 8;

    if (xkb_state_key_get_syms(_glfw.wl.xkb.state, keycode, &keysyms) == 1)
    {
        const xkb_keysym_t keysym = composeSymbol(keysyms[0]);
        const uint32_t codepoint = _glfwKeySym2Unicode(keysym);
        if (codepoint != GLFW_INVALID_CODEPOINT)
        {
            const int mods = _glfw.wl.xkb.modifiers;
            const int plain = !(mods & (GLFW_MOD_CONTROL | GLFW_MOD_ALT));
            _glfwInputChar(window, codepoint, mods, plain);
        }
    }
}